

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O3

void pbrt::defineDefaultMaterials(ofstream *file)

{
  char cVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)file,"newmtl pbrt_parser_no_materials_yet",0x23);
  cVar1 = (char)file;
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"Kd .6 .6 .6",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"Ka .1 .1 .1",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)file,"usematerial pbrt_parser_no_materials_yet",0x28);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar1);
  std::ostream::put(cVar1);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void defineDefaultMaterials(std::ofstream &file)
  {
    file << "newmtl pbrt_parser_no_materials_yet" << std::endl;
    file << "Kd .6 .6 .6" << std::endl;
    file << "Ka .1 .1 .1" << std::endl;
    file << "usematerial pbrt_parser_no_materials_yet" << std::endl << std::endl;
  }